

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int side3_2d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  
  dVar26 = *p0;
  dVar41 = p0[1];
  dVar39 = *q0 - dVar26;
  dVar44 = q0[1] - dVar41;
  dVar18 = *q1 - dVar26;
  dVar31 = q1[1] - dVar41;
  dVar33 = *q2 - dVar26;
  dVar15 = q2[1] - dVar41;
  dVar30 = ABS(dVar44);
  if (ABS(dVar44) <= ABS(dVar39)) {
    dVar30 = ABS(dVar39);
  }
  dVar9 = ABS(dVar18);
  if (ABS(dVar18) <= dVar30) {
    dVar9 = dVar30;
  }
  dVar30 = ABS(dVar31);
  if (ABS(dVar31) <= dVar9) {
    dVar30 = dVar9;
  }
  dVar9 = ABS(dVar33);
  if (ABS(dVar33) <= dVar30) {
    dVar9 = dVar30;
  }
  dVar30 = ABS(dVar15);
  if (ABS(dVar15) <= dVar9) {
    dVar30 = dVar9;
  }
  dVar22 = p2[1] - dVar41;
  dVar23 = p1[1] - dVar41;
  dVar20 = *p2 - dVar26;
  dVar21 = *p1 - dVar26;
  auVar38._0_8_ = ABS(dVar22);
  auVar38._8_8_ = ABS(dVar23);
  auVar10._8_4_ = SUB84(ABS(dVar21),0);
  auVar10._0_8_ = ABS(dVar20);
  auVar10._12_4_ = (int)((ulong)ABS(dVar21) >> 0x20);
  auVar10 = maxpd(auVar38,auVar10);
  dVar9 = auVar10._0_8_;
  uVar12 = SUB84(dVar30,0);
  uVar13 = (undefined4)((ulong)dVar30 >> 0x20);
  uVar5 = auVar10._0_4_;
  uVar7 = auVar10._4_4_;
  if ((dVar30 <= dVar9) && (uVar5 = uVar12, uVar7 = uVar13, dVar30 < dVar9)) {
    uVar12 = auVar10._0_4_;
    uVar13 = auVar10._4_4_;
  }
  dVar11 = auVar10._8_8_;
  uVar6 = auVar10._8_4_;
  uVar8 = auVar10._12_4_;
  if (((double)CONCAT44(uVar7,uVar5) < dVar11 || (double)CONCAT44(uVar7,uVar5) == dVar11) &&
     (uVar6 = uVar5, uVar8 = uVar7,
     (double)CONCAT44(uVar13,uVar12) <= dVar11 && dVar11 != (double)CONCAT44(uVar13,uVar12))) {
    uVar12 = auVar10._8_4_;
    uVar13 = auVar10._12_4_;
  }
  iVar2 = 0;
  iVar4 = 0;
  if ((2.7953252803394562e-74 < (double)CONCAT44(uVar8,uVar6) ||
       (double)CONCAT44(uVar8,uVar6) == 2.7953252803394562e-74) &&
     (iVar4 = iVar2,
     (double)CONCAT44(uVar13,uVar12) < 2.596148429267413e+33 ||
     (double)CONCAT44(uVar13,uVar12) == 2.596148429267413e+33)) {
    dVar24 = dVar21 * dVar39 + dVar23 * dVar44;
    dVar28 = dVar21 * dVar18 + dVar23 * dVar31;
    dVar1 = dVar21 * dVar33 + dVar23 * dVar15;
    dVar14 = dVar20 * dVar39 + dVar22 * dVar44;
    dVar19 = dVar20 * dVar18 + dVar22 * dVar31;
    dVar17 = dVar20 * dVar33 + dVar22 * dVar15;
    dVar24 = dVar24 + dVar24;
    dVar28 = dVar28 + dVar28;
    dVar1 = dVar1 + dVar1;
    dVar14 = dVar14 + dVar14;
    dVar19 = dVar19 + dVar19;
    dVar17 = dVar17 + dVar17;
    dVar40 = dVar28 * dVar17 - dVar19 * dVar1;
    dVar16 = dVar1 * dVar14 - dVar17 * dVar24;
    dVar25 = dVar24 * dVar19 - dVar14 * dVar28;
    dVar34 = dVar11 * dVar30 * dVar9 * dVar30 * 3.644307565376031e-14;
    dVar32 = dVar40 + dVar16 + dVar25;
    iVar2 = 1;
    if ((dVar34 < dVar32) || (iVar2 = -1, dVar32 < -dVar34)) {
      dVar26 = *p3 - dVar26;
      dVar41 = p3[1] - dVar41;
      auVar36._8_8_ = dVar30;
      auVar36._0_8_ = dVar30;
      dVar34 = ABS(dVar41);
      if (ABS(dVar41) <= dVar11) {
        dVar34 = dVar11;
      }
      dVar29 = ABS(dVar26);
      if (ABS(dVar26) <= dVar34) {
        dVar29 = dVar34;
      }
      auVar10 = maxpd(auVar10,auVar36);
      auVar37._8_8_ = dVar29;
      auVar37._0_8_ = dVar11;
      auVar38 = maxpd(auVar37,auVar10);
      dVar34 = auVar38._8_8_;
      dVar11 = dVar34;
      if (dVar34 <= auVar38._0_8_) {
        dVar11 = auVar38._0_8_;
      }
      dVar27 = auVar10._8_8_;
      dVar43 = dVar27;
      if (dVar27 <= dVar11) {
        dVar43 = dVar11;
      }
      dVar11 = dVar29;
      if (dVar29 <= dVar43) {
        dVar11 = dVar43;
      }
      dVar43 = dVar9;
      if (dVar30 <= dVar9) {
        dVar43 = dVar30;
      }
      dVar42 = dVar30;
      dVar35 = dVar11;
      if ((dVar43 <= dVar11) && (dVar42 = dVar11, dVar35 = dVar43, dVar11 <= dVar30)) {
        dVar42 = dVar30;
      }
      if (dVar42 <= 2.596148429267413e+33) {
        dVar43 = dVar34;
        if (dVar35 <= dVar34) {
          dVar43 = dVar35;
        }
        dVar42 = dVar27;
        if (dVar43 <= dVar27) {
          dVar42 = dVar43;
        }
        dVar43 = dVar29;
        if (dVar42 <= dVar29) {
          dVar43 = dVar42;
        }
        if (6.0198672948616725e-50 <= dVar43) {
          dVar21 = dVar21 * dVar21 + dVar23 * dVar23;
          dVar20 = dVar20 * dVar20 + dVar22 * dVar22;
          dVar39 = dVar39 * dVar26 + dVar44 * dVar41;
          dVar18 = dVar18 * dVar26 + dVar31 * dVar41;
          dVar15 = dVar33 * dVar26 + dVar15 * dVar41;
          dVar30 = dVar29 * dVar30 * dVar9 * dVar27 * dVar34 * dVar11 * 4.675444716138007e-13;
          dVar26 = dVar32 * (dVar26 * dVar26 + dVar41 * dVar41) -
                   ((dVar25 + (dVar14 - dVar19) * dVar21 + (dVar28 - dVar24) * dVar20) *
                    (dVar15 + dVar15) +
                   (dVar16 + (dVar17 - dVar14) * dVar21 + (dVar24 - dVar1) * dVar20) *
                   (dVar18 + dVar18) +
                   (dVar40 + (dVar19 - dVar17) * dVar21 + (dVar1 - dVar28) * dVar20) *
                   (dVar39 + dVar39));
          iVar3 = 1;
          if ((dVar30 < dVar26) || (iVar3 = -1, dVar26 < -dVar30)) {
            iVar4 = iVar3 * iVar2;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

inline int side3_2d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double l1;
    l1 = (1 * ((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double l2;
    l2 = (1 * ((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double l3;
    l3 = (1 * ((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double a10;
    a10 = (2 * ((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double a11;
    a11 = (2 * ((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double a12;
    a12 = (2 * ((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)));
    double a20;
    a20 = (2 * ((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)));
    double a21;
    a21 = (2 * ((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)));
    double a22;
    a22 = (2 * ((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)));
    double a30;
    a30 = (2 * ((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)));
    double a31;
    a31 = (2 * ((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)));
    double a32;
    a32 = (2 * ((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p2_0_p0_0);
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q2_0_p0_0)) )
    {
        max2 = fabs(q2_0_p0_0);
    } 
    if( (max2 < fabs(q2_1_p0_1)) )
    {
        max2 = fabs(q2_1_p0_1);
    } 
    double max3 = fabs(p1_0_p0_0);
    if( (max3 < fabs(p1_1_p0_1)) )
    {
        max3 = fabs(p1_1_p0_1);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 2.79532528033945620759e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (3.64430756537603111258e-14 * (((max3 * max2) * max1) * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max2;
    if( (max4 < max1) )
    {
        max4 = max1;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max2;
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max6 = max2;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    double max7 = max3;
    if( (max7 < fabs(p3_1_p0_1)) )
    {
        max7 = fabs(p3_1_p0_1);
    } 
    if( (max7 < fabs(p3_0_p0_0)) )
    {
        max7 = fabs(p3_0_p0_0);
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 6.01986729486167248087e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.67544471613800658534e-13 * (((((max7 * max2) * max1) * max6) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}